

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::write_request
          (ClientImpl *this,Stream *strm,Request *req,bool close_connection,Error *error)

{
  Headers *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pcVar3;
  size_type sVar4;
  undefined8 uVar5;
  Request *pRVar6;
  Stream *strm_00;
  char cVar7;
  int iVar8;
  const_iterator cVar9;
  long *plVar10;
  ssize_t sVar11;
  _Base_ptr p_Var12;
  int extraout_var;
  int extraout_var_00;
  compressor *compressor;
  int iVar13;
  undefined7 in_register_00000009;
  size_type *psVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args_1;
  char cVar18;
  bool bVar19;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> agent;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_c0;
  _Base_ptr local_80;
  Error *local_78;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_50;
  pointer local_48;
  Request *local_40;
  Stream *local_38;
  
  paVar1 = &local_c0.first.field_2;
  local_78 = error;
  local_38 = strm;
  if ((int)CONCAT71(in_register_00000009,close_connection) != 0) {
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Connection","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(req->headers)._M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if ((_Rb_tree_header *)cVar9._M_node == &(req->headers)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const(&)[11],char_const(&)[6]>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&req->headers,(char (*) [11])"Connection",(char (*) [6])"close");
    }
  }
  this_00 = &req->headers;
  local_c0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Host","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_c0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  local_80 = &(req->headers)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (cVar9._M_node == local_80) {
    iVar8 = (*this->_vptr_ClientImpl[6])(this);
    iVar13 = 0x50;
    if ((char)iVar8 != '\0') {
      iVar13 = 0x1bb;
    }
    __args_1 = &this->host_and_port_;
    if (this->port_ == iVar13) {
      __args_1 = &this->host_;
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[5],std::__cxx11::string_const&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [5])"Host",__args_1);
  }
  local_c0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Accept","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_c0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (cVar9._M_node == local_80) {
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[7],char_const(&)[4]>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [7])"Accept",(char (*) [4])"*/*");
  }
  local_c0.first._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"User-Agent","");
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&this_00->_M_t,&local_c0.first);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (cVar9._M_node == local_80) {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"cpp-httplib/","");
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_70);
    psVar14 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar14) {
      local_c0.first.field_2._M_allocated_capacity = *psVar14;
      local_c0.first.field_2._8_8_ = plVar10[3];
      local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_c0.first.field_2._M_allocated_capacity = *psVar14;
      local_c0.first._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_c0.first._M_string_length = plVar10[1];
    *plVar10 = (long)psVar14;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[11],std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [11])"User-Agent",&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
  }
  if ((req->body)._M_string_length == 0) {
    if ((req->content_provider_).super__Function_base._M_manager == (_Manager_type)0x0) {
      iVar8 = std::__cxx11::string::compare((char *)req);
      if (((iVar8 == 0) || (iVar8 = std::__cxx11::string::compare((char *)req), iVar8 == 0)) ||
         (iVar8 = std::__cxx11::string::compare((char *)req), iVar8 == 0)) {
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
        ::_M_emplace_equal<char_const(&)[15],char_const(&)[2]>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                    *)this_00,(char (*) [15])"Content-Length",(char (*) [2])0x151a96);
      }
      goto LAB_00133d8a;
    }
    if (req->is_chunked_content_provider_ != false) goto LAB_00133d8a;
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Length","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node != local_80) goto LAB_00133d8a;
    uVar2 = req->content_length_;
    cVar18 = '\x01';
    if (9 < uVar2) {
      uVar15 = uVar2;
      cVar7 = '\x04';
      do {
        cVar18 = cVar7;
        if (uVar15 < 100) {
          cVar18 = cVar18 + -2;
          goto LAB_00134308;
        }
        if (uVar15 < 1000) {
          cVar18 = cVar18 + -1;
          goto LAB_00134308;
        }
        if (uVar15 < 10000) goto LAB_00134308;
        bVar19 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar7 = cVar18 + '\x04';
      } while (bVar19);
      cVar18 = cVar18 + '\x01';
    }
LAB_00134308:
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0.first._M_dataplus._M_p,(uint)local_c0.first._M_string_length,uVar2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[15],std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [15])"Content-Length",&local_c0.first);
  }
  else {
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Type","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node == local_80) {
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<char_const(&)[13],char_const(&)[11]>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,(char (*) [13])"Content-Type",(char (*) [11])"text/plain");
    }
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Content-Length","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node != local_80) goto LAB_00133d8a;
    uVar2 = (req->body)._M_string_length;
    cVar18 = '\x01';
    if (9 < uVar2) {
      uVar15 = uVar2;
      cVar7 = '\x04';
      do {
        cVar18 = cVar7;
        if (uVar15 < 100) {
          cVar18 = cVar18 + -2;
          goto LAB_00133d3f;
        }
        if (uVar15 < 1000) {
          cVar18 = cVar18 + -1;
          goto LAB_00133d3f;
        }
        if (uVar15 < 10000) goto LAB_00133d3f;
        bVar19 = 99999 < uVar15;
        uVar15 = uVar15 / 10000;
        cVar7 = cVar18 + '\x04';
      } while (bVar19);
      cVar18 = cVar18 + '\x01';
    }
LAB_00133d3f:
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_c0,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_c0.first._M_dataplus._M_p,(uint)local_c0.first._M_string_length,uVar2);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
    ::_M_emplace_equal<char_const(&)[15],std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)this_00,(char (*) [15])"Content-Length",&local_c0.first);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.first._M_dataplus._M_p != paVar1) {
    operator_delete(local_c0.first._M_dataplus._M_p,local_c0.first.field_2._M_allocated_capacity + 1
                   );
  }
LAB_00133d8a:
  if ((this->basic_auth_username_)._M_string_length != 0 ||
      (this->basic_auth_password_)._M_string_length != 0) {
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Authorization","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node == local_80) {
      make_basic_authentication_header
                (&local_c0,&this->basic_auth_username_,&this->basic_auth_password_,false);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.second._M_dataplus._M_p != &local_c0.second.field_2) {
        operator_delete(local_c0.second._M_dataplus._M_p,
                        local_c0.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.first._M_dataplus._M_p,
                        local_c0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (((this->proxy_basic_auth_username_)._M_string_length != 0) &&
     ((this->proxy_basic_auth_password_)._M_string_length != 0)) {
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Proxy-Authorization","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node == local_80) {
      make_basic_authentication_header
                (&local_c0,&this->proxy_basic_auth_username_,&this->proxy_basic_auth_password_,true)
      ;
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.second._M_dataplus._M_p != &local_c0.second.field_2) {
        operator_delete(local_c0.second._M_dataplus._M_p,
                        local_c0.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.first._M_dataplus._M_p,
                        local_c0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((this->bearer_token_auth_token_)._M_string_length != 0) {
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Authorization","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node == local_80) {
      make_bearer_token_authentication_header(&local_c0,&this->bearer_token_auth_token_,false);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.second._M_dataplus._M_p != &local_c0.second.field_2) {
        operator_delete(local_c0.second._M_dataplus._M_p,
                        local_c0.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.first._M_dataplus._M_p,
                        local_c0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if ((this->proxy_bearer_token_auth_token_)._M_string_length != 0) {
    local_c0.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Proxy-Authorization","");
    cVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&this_00->_M_t,&local_c0.first);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_c0.first._M_dataplus._M_p,
                      local_c0.first.field_2._M_allocated_capacity + 1);
    }
    if (cVar9._M_node == local_80) {
      make_bearer_token_authentication_header(&local_c0,&this->proxy_bearer_token_auth_token_,true);
      std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::_M_emplace_equal<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)this_00,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.second._M_dataplus._M_p != &local_c0.second.field_2) {
        operator_delete(local_c0.second._M_dataplus._M_p,
                        local_c0.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0.first._M_dataplus._M_p != paVar1) {
        operator_delete(local_c0.first._M_dataplus._M_p,
                        local_c0.first.field_2._M_allocated_capacity + 1);
      }
    }
  }
  local_c0.first._M_string_length = (long)&local_c0.first.field_2 + 8;
  local_c0.first._M_dataplus._M_p = (pointer)&PTR__BufferStream_001701a8;
  local_c0.first.field_2._M_allocated_capacity = 0;
  local_c0.first.field_2._8_8_ = local_c0.first.field_2._8_8_ & 0xffffffffffffff00;
  local_c0.second._M_string_length = 0;
  if (this->url_encode_ == true) {
    detail::encode_url(&local_70,&req->path);
  }
  else {
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    pcVar3 = (req->path)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar3,pcVar3 + (req->path)._M_string_length);
  }
  local_48 = (req->method)._M_dataplus._M_p;
  local_50 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_70._M_dataplus._M_p;
  Stream::write_format<char_const*,char_const*>
            ((Stream *)&local_c0,"%s %s HTTP/1.1\r\n",&local_48,(char **)&local_50);
  p_Var12 = (req->headers)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  bVar19 = p_Var12 == local_80;
  local_40 = req;
  if (!bVar19) {
    do {
      local_48 = *(pointer *)(p_Var12 + 1);
      local_50 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   **)(p_Var12 + 2);
      sVar11 = Stream::write_format<char_const*,char_const*>
                         ((Stream *)&local_c0,"%s: %s\r\n",&local_48,(char **)&local_50);
      if (sVar11 < 0) break;
      p_Var12 = (_Base_ptr)std::_Rb_tree_increment(p_Var12);
      bVar19 = p_Var12 == local_80;
    } while (!bVar19);
  }
  if (bVar19) {
    (**(code **)(local_c0.first._M_dataplus._M_p + 0x28))(&local_c0,"\r\n",2);
  }
  strm_00 = local_38;
  uVar5 = local_c0.first.field_2._M_allocated_capacity;
  sVar4 = local_c0.first._M_string_length;
  uVar2 = 0;
  do {
    uVar15 = uVar2;
    if ((ulong)uVar5 <= uVar15) goto LAB_001341d1;
    iVar8 = (*strm_00->_vptr_Stream[5])(strm_00,(undefined1 *)(sVar4 + uVar15));
    lVar17 = 0;
    if (-1 < extraout_var) {
      lVar17 = CONCAT44(extraout_var,iVar8);
    }
    uVar2 = lVar17 + uVar15;
  } while (-1 < extraout_var);
  if (uVar15 < (ulong)uVar5) {
    *local_78 = Write;
  }
LAB_001341d1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  pRVar6 = local_40;
  local_c0.first._M_dataplus._M_p = (pointer)&PTR__BufferStream_001701a8;
  if ((undefined1 *)local_c0.first._M_string_length !=
      (undefined1 *)((long)&local_c0.first.field_2 + 8)) {
    operator_delete((void *)local_c0.first._M_string_length,local_c0.first.field_2._8_8_ + 1);
  }
  if ((ulong)uVar5 <= uVar15) {
    uVar2 = (pRVar6->body)._M_string_length;
    if (uVar2 == 0) {
      if (pRVar6->is_chunked_content_provider_ == true) {
        compressor = (compressor *)operator_new(8);
        compressor->_vptr_compressor = (_func_int **)&PTR__compressor_00170130;
        bVar19 = detail::
                 write_content_chunked<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_,httplib::detail::compressor>
                           (strm_00,&pRVar6->content_provider_,(anon_class_1_0_00000001 *)&local_c0,
                            compressor,local_78);
        (*compressor->_vptr_compressor[1])(compressor);
        return bVar19;
      }
      bVar19 = detail::
               write_content<httplib::ClientImpl::write_content_with_provider(httplib::Stream&,httplib::Request_const&,httplib::Error&)::_lambda()_1_>
                         (strm_00,&pRVar6->content_provider_,0,pRVar6->content_length_,local_78);
      return bVar19;
    }
    pcVar3 = (pRVar6->body)._M_dataplus._M_p;
    uVar15 = 0;
    do {
      uVar16 = uVar15;
      if (uVar2 <= uVar16) {
        return true;
      }
      iVar8 = (*strm_00->_vptr_Stream[5])(strm_00,pcVar3 + uVar16);
      lVar17 = 0;
      if (-1 < extraout_var_00) {
        lVar17 = CONCAT44(extraout_var_00,iVar8);
      }
      uVar15 = lVar17 + uVar16;
    } while (-1 < extraout_var_00);
    if (uVar2 <= uVar16) {
      return true;
    }
    *local_78 = Write;
  }
  return false;
}

Assistant:

inline bool ClientImpl::write_request(Stream &strm, Request &req,
                                      bool close_connection, Error &error) {
  // Prepare additional headers
  if (close_connection) {
    if (!req.has_header("Connection")) {
      req.headers.emplace("Connection", "close");
    }
  }

  if (!req.has_header("Host")) {
    if (is_ssl()) {
      if (port_ == 443) {
        req.headers.emplace("Host", host_);
      } else {
        req.headers.emplace("Host", host_and_port_);
      }
    } else {
      if (port_ == 80) {
        req.headers.emplace("Host", host_);
      } else {
        req.headers.emplace("Host", host_and_port_);
      }
    }
  }

  if (!req.has_header("Accept")) { req.headers.emplace("Accept", "*/*"); }

#ifndef CPPHTTPLIB_NO_DEFAULT_USER_AGENT
  if (!req.has_header("User-Agent")) {
    auto agent = std::string("cpp-httplib/") + CPPHTTPLIB_VERSION;
    req.headers.emplace("User-Agent", agent);
  }
#endif

  if (req.body.empty()) {
    if (req.content_provider_) {
      if (!req.is_chunked_content_provider_) {
        if (!req.has_header("Content-Length")) {
          auto length = std::to_string(req.content_length_);
          req.headers.emplace("Content-Length", length);
        }
      }
    } else {
      if (req.method == "POST" || req.method == "PUT" ||
          req.method == "PATCH") {
        req.headers.emplace("Content-Length", "0");
      }
    }
  } else {
    if (!req.has_header("Content-Type")) {
      req.headers.emplace("Content-Type", "text/plain");
    }

    if (!req.has_header("Content-Length")) {
      auto length = std::to_string(req.body.size());
      req.headers.emplace("Content-Length", length);
    }
  }

  if (!basic_auth_password_.empty() || !basic_auth_username_.empty()) {
    if (!req.has_header("Authorization")) {
      req.headers.insert(make_basic_authentication_header(
          basic_auth_username_, basic_auth_password_, false));
    }
  }

  if (!proxy_basic_auth_username_.empty() &&
      !proxy_basic_auth_password_.empty()) {
    if (!req.has_header("Proxy-Authorization")) {
      req.headers.insert(make_basic_authentication_header(
          proxy_basic_auth_username_, proxy_basic_auth_password_, true));
    }
  }

  if (!bearer_token_auth_token_.empty()) {
    if (!req.has_header("Authorization")) {
      req.headers.insert(make_bearer_token_authentication_header(
          bearer_token_auth_token_, false));
    }
  }

  if (!proxy_bearer_token_auth_token_.empty()) {
    if (!req.has_header("Proxy-Authorization")) {
      req.headers.insert(make_bearer_token_authentication_header(
          proxy_bearer_token_auth_token_, true));
    }
  }

  // Request line and headers
  {
    detail::BufferStream bstrm;

    const auto &path = url_encode_ ? detail::encode_url(req.path) : req.path;
    bstrm.write_format("%s %s HTTP/1.1\r\n", req.method.c_str(), path.c_str());

    detail::write_headers(bstrm, req.headers);

    // Flush buffer
    auto &data = bstrm.get_buffer();
    if (!detail::write_data(strm, data.data(), data.size())) {
      error = Error::Write;
      return false;
    }
  }

  // Body
  if (req.body.empty()) {
    return write_content_with_provider(strm, req, error);
  }

  if (!detail::write_data(strm, req.body.data(), req.body.size())) {
    error = Error::Write;
    return false;
  }

  return true;
}